

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *
__thiscall cmComputeLinkDepends::Compute(cmComputeLinkDepends *this)

{
  int iVar1;
  pointer piVar2;
  cmGeneratorTarget *this_00;
  pointer pLVar3;
  BFSEntry qe;
  bool bVar4;
  TargetType TVar5;
  BFSEntry *pBVar6;
  cmComputeComponentGraph *this_01;
  value_type *__x;
  iterator __position;
  iterator r;
  _Base_ptr p_Var7;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __tmp_1;
  long lVar8;
  _Base_ptr p_Var9;
  pointer piVar10;
  long lVar11;
  SharedDepEntry *dep;
  LinkEntry *__b;
  EntryVector *pEVar12;
  pointer __p;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __tmp;
  pointer pLVar13;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar14;
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> emitted;
  int local_7c;
  EntryVector *local_78;
  LinkEntry *local_70;
  _Rb_tree_node_base *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  AddDirectLinkEntries(this);
  pBVar6 = (this->BFSQueue).c.
           super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->BFSQueue).c.
      super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != pBVar6) {
    do {
      qe = *pBVar6;
      std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>::
      pop_front(&(this->BFSQueue).c);
      FollowLinkEntry(this,qe);
      pBVar6 = (this->BFSQueue).c.
               super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->BFSQueue).c.
             super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur != pBVar6);
  }
  dep = (this->SharedDepQueue).c.
        super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->SharedDepQueue).c.
      super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != dep) {
    do {
      HandleSharedDependency(this,dep);
      std::
      deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
      ::pop_front(&(this->SharedDepQueue).c);
      dep = (this->SharedDepQueue).c.
            super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->SharedDepQueue).c.
             super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur != dep);
  }
  InferDependencies(this);
  UpdateGroupDependencies(this);
  CleanConstraintGraph(this);
  if (this->DebugMode == true) {
    Compute(this);
  }
  this_01 = (cmComputeComponentGraph *)operator_new(0xd8);
  cmComputeComponentGraph::cmComputeComponentGraph(this_01,&this->EntryConstraintGraph);
  local_60._M_impl._0_8_ = 0;
  std::__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
  reset((__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_> *)
        &this->CCG,this_01);
  std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
  ~unique_ptr((unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_> *)
              &local_60);
  cmComputeComponentGraph::Compute
            ((this->CCG)._M_t.
             super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
             .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl);
  bVar4 = CheckCircularDependencies(this);
  if (bVar4) {
    OrderLinkEntries(this);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    piVar2 = (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar10 = (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (piVar10 != piVar2) {
      do {
        iVar1 = piVar10[-1];
        pLVar13 = (this->EntryList).
                  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        this_00 = pLVar13[iVar1].Target;
        local_7c = iVar1;
        if (((this_00 == (cmGeneratorTarget *)0x0) ||
            (TVar5 = cmGeneratorTarget::GetType(this_00), TVar5 != SHARED_LIBRARY)) ||
           (pVar14 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                     _M_insert_unique<int_const&>
                               ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                 *)&local_60,&local_7c),
           ((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
          std::
          vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
          ::push_back(&this->FinalLinkEntries,pLVar13 + iVar1);
        }
        piVar10 = piVar10 + -1;
      } while (piVar10 != piVar2);
    }
    piVar2 = (this->ObjectEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pEVar12 = &this->FinalLinkEntries;
    for (piVar10 = (this->ObjectEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish; piVar10 != piVar2; piVar10 = piVar10 + -1) {
      std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>::
      emplace_back<cmComputeLinkDepends::LinkEntry&>
                ((vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>
                  *)pEVar12,
                 (this->EntryList).
                 super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start + piVar10[-1]);
    }
    pLVar13 = (this->FinalLinkEntries).
              super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar3 = (this->FinalLinkEntries).
             super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __b = pLVar3 + -1;
    if (pLVar13 < __b && pLVar13 != pLVar3) {
      do {
        std::swap<cmComputeLinkDepends::LinkEntry>(pLVar13,__b);
        pLVar13 = pLVar13 + 1;
        __b = __b + -1;
      } while (pLVar13 < __b);
    }
    local_78 = pEVar12;
    if ((this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      p_Var7 = (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_68 = &(this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (p_Var7 != local_68) {
LAB_00549c29:
        __x = (this->EntryList).
              super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
              ._M_impl.super__Vector_impl_data._M_start + (int)p_Var7[1]._M_color;
        r._M_current = (this->FinalLinkEntries).
                       super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_70 = (this->FinalLinkEntries).
                     super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          lVar11 = (long)local_70 - (long)r._M_current;
          lVar8 = (lVar11 >> 5) * -0x5555555555555555 >> 2;
          if (0 < lVar8) {
            lVar8 = lVar8 + 1;
            do {
              bVar4 = ::operator==(&__x->Item,&(r._M_current)->Item);
              __position._M_current = r._M_current;
              if (bVar4) goto LAB_00549d85;
              bVar4 = ::operator==(&__x->Item,&r._M_current[1].Item);
              __position._M_current = r._M_current + 1;
              if (bVar4) goto LAB_00549d85;
              bVar4 = ::operator==(&__x->Item,&r._M_current[2].Item);
              __position._M_current = r._M_current + 2;
              if (bVar4) goto LAB_00549d85;
              bVar4 = ::operator==(&__x->Item,&r._M_current[3].Item);
              __position._M_current = r._M_current + 3;
              if (bVar4) goto LAB_00549d85;
              r._M_current = r._M_current + 4;
              lVar8 = lVar8 + -1;
              lVar11 = lVar11 + -0x180;
            } while (1 < lVar8);
          }
          lVar8 = (lVar11 >> 5) * -0x5555555555555555;
          if (lVar8 == 1) {
LAB_00549d6f:
            bVar4 = ::operator==(&__x->Item,&(r._M_current)->Item);
            __position._M_current = local_70;
            if (bVar4) {
              __position._M_current = r._M_current;
            }
          }
          else {
            __position._M_current = r._M_current;
            if (lVar8 == 2) {
LAB_00549d44:
              bVar4 = ::operator==(&__x->Item,&(__position._M_current)->Item);
              if (!bVar4) {
                r._M_current = __position._M_current + 1;
                goto LAB_00549d6f;
              }
            }
            else {
              __position._M_current = local_70;
              if ((lVar8 == 3) &&
                 (bVar4 = ::operator==(&__x->Item,&(r._M_current)->Item),
                 __position._M_current = r._M_current, !bVar4)) {
                __position._M_current = r._M_current + 1;
                goto LAB_00549d44;
              }
            }
          }
LAB_00549d85:
          if (__position._M_current ==
              (this->FinalLinkEntries).
              super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00549e14;
          std::__cxx11::string::_M_replace
                    ((ulong)__position._M_current,0,
                     (char *)((__position._M_current)->Item).Value._M_string_length,0x785b1d);
          pEVar12 = local_78;
          for (p_Var9 = p_Var7[1]._M_left; p_Var9 != p_Var7[1]._M_parent;
              p_Var9 = (_Base_ptr)((long)&p_Var9[-1]._M_right + 4)) {
            __position = std::
                         vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                         ::insert(pEVar12,__position._M_current,
                                  (this->EntryList).
                                  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                                  *(int *)((long)&p_Var9[-1]._M_right + 4));
          }
          r = std::
              vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
              ::insert(pEVar12,__position._M_current,__x);
          std::__cxx11::string::_M_replace
                    ((ulong)r._M_current,0,(char *)((r._M_current)->Item).Value._M_string_length,
                     0x785b2b);
        } while( true );
      }
    }
LAB_00549e2a:
    pEVar12 = local_78;
    if (this->DebugMode == true) {
      DisplayFinalEntries(this);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_60);
  }
  else {
    pEVar12 = &this->FinalLinkEntries;
  }
  return pEVar12;
LAB_00549e14:
  p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
  if (p_Var7 == local_68) goto LAB_00549e2a;
  goto LAB_00549c29;
}

Assistant:

std::vector<cmComputeLinkDepends::LinkEntry> const&
cmComputeLinkDepends::Compute()
{
  // Follow the link dependencies of the target to be linked.
  this->AddDirectLinkEntries();

  // Complete the breadth-first search of dependencies.
  while (!this->BFSQueue.empty()) {
    // Get the next entry.
    BFSEntry qe = this->BFSQueue.front();
    this->BFSQueue.pop();

    // Follow the entry's dependencies.
    this->FollowLinkEntry(qe);
  }

  // Complete the search of shared library dependencies.
  while (!this->SharedDepQueue.empty()) {
    // Handle the next entry.
    this->HandleSharedDependency(this->SharedDepQueue.front());
    this->SharedDepQueue.pop();
  }

  // Infer dependencies of targets for which they were not known.
  this->InferDependencies();

  // finalize groups dependencies
  // All dependencies which are raw items must be replaced by the group
  // it belongs to, if any.
  this->UpdateGroupDependencies();

  // Cleanup the constraint graph.
  this->CleanConstraintGraph();

  // Display the constraint graph.
  if (this->DebugMode) {
    fprintf(stderr,
            "---------------------------------------"
            "---------------------------------------\n");
    fprintf(stderr, "Link dependency analysis for target %s, config %s\n",
            this->Target->GetName().c_str(),
            this->HasConfig ? this->Config.c_str() : "noconfig");
    this->DisplayConstraintGraph();
  }

  // Compute the DAG of strongly connected components.  The algorithm
  // used by cmComputeComponentGraph should identify the components in
  // the same order in which the items were originally discovered in
  // the BFS.  This should preserve the original order when no
  // constraints disallow it.
  this->CCG =
    cm::make_unique<cmComputeComponentGraph>(this->EntryConstraintGraph);
  this->CCG->Compute();

  if (!this->CheckCircularDependencies()) {
    return this->FinalLinkEntries;
  }

  // Compute the final ordering.
  this->OrderLinkEntries();

  // Compute the final set of link entries.
  // Iterate in reverse order so we can keep only the last occurrence
  // of a shared library.
  std::set<int> emitted;
  for (int i : cmReverseRange(this->FinalLinkOrder)) {
    LinkEntry const& e = this->EntryList[i];
    cmGeneratorTarget const* t = e.Target;
    // Entries that we know the linker will re-use do not need to be repeated.
    bool uniquify = t && t->GetType() == cmStateEnums::SHARED_LIBRARY;
    if (!uniquify || emitted.insert(i).second) {
      this->FinalLinkEntries.push_back(e);
    }
  }
  // Place explicitly linked object files in the front.  The linker will
  // always use them anyway, and they may depend on symbols from libraries.
  // Append in reverse order since we reverse the final order below.
  for (int i : cmReverseRange(this->ObjectEntries)) {
    this->FinalLinkEntries.emplace_back(this->EntryList[i]);
  }
  // Reverse the resulting order since we iterated in reverse.
  std::reverse(this->FinalLinkEntries.begin(), this->FinalLinkEntries.end());

  // Expand group items
  if (!this->GroupItems.empty()) {
    for (const auto& group : this->GroupItems) {
      const LinkEntry& groupEntry = this->EntryList[group.first];
      auto it = this->FinalLinkEntries.begin();
      while (true) {
        it = std::find_if(it, this->FinalLinkEntries.end(),
                          [&groupEntry](const LinkEntry& entry) -> bool {
                            return groupEntry.Item == entry.Item;
                          });
        if (it == this->FinalLinkEntries.end()) {
          break;
        }
        it->Item.Value = "</LINK_GROUP>";
        for (auto i = group.second.rbegin(); i != group.second.rend(); ++i) {
          it = this->FinalLinkEntries.insert(it, this->EntryList[*i]);
        }
        it = this->FinalLinkEntries.insert(it, groupEntry);
        it->Item.Value = "<LINK_GROUP>";
      }
    }
  }

  // Display the final set.
  if (this->DebugMode) {
    this->DisplayFinalEntries();
  }

  return this->FinalLinkEntries;
}